

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

bool __thiscall
cmConditionEvaluator::GetBooleanValue(cmConditionEvaluator *this,cmExpandedCommandArgument *arg)

{
  bool bVar1;
  bool bVar2;
  string *psVar3;
  char *extraout_RDX;
  double dVar4;
  string_view value;
  string_view value_00;
  cmValue def;
  cmValue local_20;
  
  psVar3 = cmExpandedCommandArgument::GetValue_abi_cxx11_(arg);
  value._M_str = extraout_RDX;
  value._M_len = (size_t)(psVar3->_M_dataplus)._M_p;
  bVar1 = cmValue::IsOn((cmValue *)psVar3->_M_string_length,value);
  bVar2 = true;
  if (!bVar1) {
    psVar3 = cmExpandedCommandArgument::GetValue_abi_cxx11_(arg);
    value_00._M_str = (psVar3->_M_dataplus)._M_p;
    value_00._M_len = psVar3->_M_string_length;
    bVar1 = cmValue::IsOff(value_00);
    if (bVar1) {
      bVar2 = false;
    }
    else {
      bVar1 = cmExpandedCommandArgument::empty(arg);
      if (!bVar1) {
        psVar3 = cmExpandedCommandArgument::GetValue_abi_cxx11_(arg);
        dVar4 = strtod((psVar3->_M_dataplus)._M_p,(char **)&local_20);
        if (*(char *)&((local_20.Value)->_M_dataplus)._M_p == '\0') {
          return (bool)(-(dVar4 != 0.0) & 1);
        }
      }
      local_20 = GetDefinitionIfUnquoted(this,arg);
      bVar2 = cmValue::IsOff(&local_20);
      bVar2 = !bVar2;
    }
  }
  return bVar2;
}

Assistant:

bool cmConditionEvaluator::GetBooleanValue(
  cmExpandedCommandArgument& arg) const
{
  // Check basic and named constants.
  if (cmIsOn(arg.GetValue())) {
    return true;
  }
  if (cmIsOff(arg.GetValue())) {
    return false;
  }

  // Check for numbers.
  if (!arg.empty()) {
    char* end;
    const double d = std::strtod(arg.GetValue().c_str(), &end);
    if (*end == '\0') {
      // The whole string is a number.  Use C conversion to bool.
      return static_cast<bool>(d);
    }
  }

  // Check definition.
  cmValue def = this->GetDefinitionIfUnquoted(arg);
  return !def.IsOff();
}